

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_4_aarch64
               (TCGContext_conflict1 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t cofs,uint32_t oprsz,uint32_t maxsz,GVecGen4_conflict1 *g)

{
  _Bool _Var1;
  byte bVar2;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGv_i64_conflict1 *p_Var3;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *p_Var4;
  TCGType TVar5;
  uint uVar6;
  uint32_t tysz;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict1 *fni;
  TCGv_i64 local_88;
  TCGv_i64 local_80;
  TCGv_i64 local_78;
  TCGv_i64 local_70;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict1 *)0x0
     ) {
switchD_00621dbb_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var3 = g->fni8,
       p_Var3 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGv_i64_conflict1 *)0x0)) {
      _Var1 = g->write_aofs;
      local_70 = tcg_temp_new_i64(tcg_ctx);
      local_88 = tcg_temp_new_i64(tcg_ctx);
      local_78 = tcg_temp_new_i64(tcg_ctx);
      local_80 = tcg_temp_new_i64(tcg_ctx);
      for (uVar6 = 0; uVar6 < oprsz; uVar6 = uVar6 + 8) {
        tcg_gen_ld_i64_aarch64(tcg_ctx,local_88,tcg_ctx->cpu_env,(ulong)(aofs + uVar6));
        tcg_gen_ld_i64_aarch64(tcg_ctx,local_78,tcg_ctx->cpu_env,(ulong)(bofs + uVar6));
        tcg_gen_ld_i64_aarch64(tcg_ctx,local_80,tcg_ctx->cpu_env,(ulong)(cofs + uVar6));
        (*p_Var3)(tcg_ctx,local_70,local_88,local_78,local_80);
        tcg_gen_st_i64_aarch64(tcg_ctx,local_70,tcg_ctx->cpu_env,(ulong)(dofs + uVar6));
        if (_Var1 != false) {
          tcg_gen_st_i64_aarch64(tcg_ctx,local_88,tcg_ctx->cpu_env,(ulong)(aofs + uVar6));
        }
      }
    }
    else {
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var4 = g->fni4,
         p_Var4 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *)0x0))
      {
        if (g->fno != (undefined1 *)0x0) {
          tcg_gen_gvec_4_ool_aarch64(tcg_ctx,dofs,aofs,bofs,cofs,oprsz,maxsz,g->data,g->fno);
          return;
        }
        __assert_fail("g->fno != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                      ,0x58b,
                      "void tcg_gen_gvec_4_aarch64(TCGContext *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const GVecGen4 *)"
                     );
      }
      _Var1 = g->write_aofs;
      local_70 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      local_88 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      local_78 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      local_80 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      for (uVar6 = 0; uVar6 < oprsz; uVar6 = uVar6 + 4) {
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)local_88,tcg_ctx->cpu_env,(ulong)(aofs + uVar6));
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)local_78,tcg_ctx->cpu_env,(ulong)(bofs + uVar6));
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)local_80,tcg_ctx->cpu_env,(ulong)(cofs + uVar6));
        (*p_Var4)(tcg_ctx,(TCGv_i32)local_70,(TCGv_i32)local_88,(TCGv_i32)local_78,
                  (TCGv_i32)local_80);
        tcg_gen_st_i32(tcg_ctx,(TCGv_i32)local_70,tcg_ctx->cpu_env,(ulong)(dofs + uVar6));
        if (_Var1 != false) {
          tcg_gen_st_i32(tcg_ctx,(TCGv_i32)local_88,tcg_ctx->cpu_env,(ulong)(aofs + uVar6));
        }
      }
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_80 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_78 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_88 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_70 + (long)tcg_ctx));
    goto LAB_0062215d;
  }
  TVar5 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
  switch(TVar5) {
  case TCG_TYPE_I32:
    goto switchD_00621dbb_caseD_0;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0x593,(char *)0x0);
  case TCG_TYPE_V64:
    bVar2 = g->vece;
    _Var1 = g->write_aofs;
    fni = g->fniv;
    TVar5 = TCG_TYPE_V64;
    tysz = 8;
    goto LAB_00622152;
  case TCG_TYPE_V128:
    break;
  case TCG_TYPE_V256:
    uVar6 = oprsz & 0xffffffe0;
    expand_4_vec(tcg_ctx,(uint)g->vece,dofs,aofs,bofs,cofs,uVar6,0x20,TCG_TYPE_V256,g->write_aofs,
                 g->fniv);
    if (uVar6 == oprsz) goto LAB_0062215d;
    dofs = dofs + uVar6;
    aofs = aofs + uVar6;
    bofs = bofs + uVar6;
    cofs = cofs + uVar6;
    oprsz = oprsz & 0x1f;
    maxsz = maxsz - uVar6;
  }
  bVar2 = g->vece;
  _Var1 = g->write_aofs;
  fni = g->fniv;
  TVar5 = TCG_TYPE_V128;
  tysz = 0x10;
LAB_00622152:
  expand_4_vec(tcg_ctx,(uint)bVar2,dofs,aofs,bofs,cofs,oprsz,tysz,TVar5,_Var1,fni);
LAB_0062215d:
  if (maxsz < oprsz || maxsz - oprsz == 0) {
    return;
  }
  expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
  return;
}

Assistant:

void tcg_gen_gvec_4(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs, uint32_t cofs,
                    uint32_t oprsz, uint32_t maxsz, const GVecGen4 *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs | bofs | cofs);
    check_overlap_4(dofs, aofs, bofs, cofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, some,
                     32, TCG_TYPE_V256, g->write_aofs, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        bofs += some;
        cofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, oprsz,
                     16, TCG_TYPE_V128, g->write_aofs, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_4_vec(tcg_ctx, g->vece, dofs, aofs, bofs, cofs, oprsz,
                     8, TCG_TYPE_V64, g->write_aofs, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_4_i64(tcg_ctx, dofs, aofs, bofs, cofs, oprsz,
                         g->write_aofs, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_4_i32(tcg_ctx, dofs, aofs, bofs, cofs, oprsz,
                         g->write_aofs, g->fni4);
        } else {
            assert(g->fno != NULL);
            tcg_gen_gvec_4_ool(tcg_ctx, dofs, aofs, bofs, cofs,
                               oprsz, maxsz, g->data, g->fno);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}